

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoApi.c
# Opt level: O0

void Extra_ReorderSetMinimizationType(reo_man *p,reo_min_type fMinType)

{
  reo_min_type fMinType_local;
  reo_man *p_local;
  
  if (fMinType == REO_MINIMIZE_NODES) {
    p->fMinWidth = 0;
    p->fMinApl = 0;
  }
  else if (fMinType == REO_MINIMIZE_WIDTH) {
    p->fMinWidth = 1;
    p->fMinApl = 0;
  }
  else {
    if (fMinType != REO_MINIMIZE_APL) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoApi.c"
                    ,0x8d,"void Extra_ReorderSetMinimizationType(reo_man *, reo_min_type)");
    }
    p->fMinWidth = 0;
    p->fMinApl = 1;
  }
  return;
}

Assistant:

void Extra_ReorderSetMinimizationType( reo_man * p, reo_min_type fMinType )
{
    if ( fMinType == REO_MINIMIZE_NODES ) 
    {
        p->fMinWidth = 0;
        p->fMinApl   = 0;
    }
    else if ( fMinType == REO_MINIMIZE_WIDTH )
    {
        p->fMinWidth = 1;
        p->fMinApl   = 0;
    }
    else if ( fMinType == REO_MINIMIZE_APL )
    {
        p->fMinWidth = 0;
        p->fMinApl   = 1;
    }
    else 
    {
        assert( 0 );
    }
}